

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

void lose_weapon_skill(int n)

{
  uint skill_00;
  int iVar1;
  int local_c;
  int skill;
  int n_local;
  
  local_c = n;
  while( true ) {
    do {
      while( true ) {
        local_c = local_c + -1;
        if (local_c < 0) {
          return;
        }
        if (u.weapon_slots == 0) break;
        u.weapon_slots = u.weapon_slots + -1;
      }
    } while (u.skills_advanced == 0);
    u.skills_advanced = u.skills_advanced + -1;
    skill_00 = (uint)u.skill_record[u.skills_advanced];
    if (u.weapon_skills[(int)skill_00].skill < '\x02') break;
    u.weapon_skills[(int)skill_00].skill = u.weapon_skills[(int)skill_00].skill + -1;
    iVar1 = slots_required(skill_00);
    u.weapon_slots = iVar1 + -1;
  }
  panic("lose_weapon_skill (%d)",(ulong)skill_00);
}

Assistant:

void lose_weapon_skill(int n)
{
    int skill;

    while (--n >= 0) {
	/* deduct first from unused slots, then from last placed slot, if any */
	if (u.weapon_slots) {
	    u.weapon_slots--;
	} else if (u.skills_advanced) {
	    skill = u.skill_record[--u.skills_advanced];
	    if (P_SKILL(skill) <= P_UNSKILLED)
		panic("lose_weapon_skill (%d)", skill);
	    P_SKILL(skill)--;	/* drop skill one level */
	    /* Lost skill might have taken more than one slot; refund rest. */
	    u.weapon_slots = slots_required(skill) - 1;
	    /* It might now be possible to advance some other pending
	       skill by using the refunded slots, but giving a message
	       to that effect would seem pretty confusing.... */
	}
    }
}